

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O1

void X509V3_conf_free(CONF_VALUE *val)

{
  if (val != (CONF_VALUE *)0x0) {
    OPENSSL_free(val->name);
    OPENSSL_free(val->value);
    OPENSSL_free(val->section);
    OPENSSL_free(val);
    return;
  }
  return;
}

Assistant:

void X509V3_conf_free(CONF_VALUE *conf) {
  if (!conf) {
    return;
  }
  OPENSSL_free(conf->name);
  OPENSSL_free(conf->value);
  OPENSSL_free(conf->section);
  OPENSSL_free(conf);
}